

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

void __thiscall lzham::lzham_decompressor::reset_arith_tables(lzham_decompressor *this)

{
  long in_RDI;
  uint i_1;
  uint i;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 0xc; local_c = local_c + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x5e8 + (ulong)local_c * 2));
  }
  for (local_10 = 0; local_10 < 0xc; local_10 = local_10 + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x600 + (ulong)local_10 * 2));
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x618 + (ulong)local_10 * 2));
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x630 + (ulong)local_10 * 2));
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x648 + (ulong)local_10 * 2));
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x660 + (ulong)local_10 * 2));
  }
  return;
}

Assistant:

void lzham_decompressor::reset_arith_tables()
   {
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_match_model); i++)
         m_is_match_model[i].clear();

      for (uint i = 0; i < CLZDecompBase::cNumStates; i++)
      {
         m_is_rep_model[i].clear();
         m_is_rep0_model[i].clear();
         m_is_rep0_single_byte_model[i].clear();
         m_is_rep1_model[i].clear();
         m_is_rep2_model[i].clear();
      }
   }